

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O3

void __thiscall
stored_flag_reader<setup::data_entry::flags_Enum_>::add
          (stored_flag_reader<setup::data_entry::flags_Enum_> *this,enum_type flag)

{
  size_t sVar1;
  char buffer [1];
  byte local_19;
  
  sVar1 = this->pos;
  if (sVar1 == 0) {
    this->bytes = this->bytes + 1;
    std::istream::read((char *)this->stream,(long)&local_19);
    this->buffer = local_19;
    sVar1 = this->pos;
  }
  else {
    local_19 = this->buffer;
  }
  if ((local_19 >> ((uint)sVar1 & 0x1f) & 1) != 0) {
    if (BZipped < flag) {
      std::__throw_out_of_range_fmt
                ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",flag,0xc);
    }
    (this->result)._flags.super__Base_bitset<1UL>._M_w =
         (this->result)._flags.super__Base_bitset<1UL>._M_w | 1L << ((byte)flag & 0x3f);
  }
  this->pos = (ulong)((uint)sVar1 + 1 & 7);
  return;
}

Assistant:

void add(enum_type flag) {
		
		if(pos == 0) {
			bytes++;
			buffer = util::load<stored_type>(stream);
		}
		
		if(buffer & (stored_type(1) << pos)) {
			result |= flag;
		}
		
		pos = (pos + 1) % stored_bits;
	}